

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertHelper *this_00;
  AssertHelper *this_01;
  char *in_RDI;
  value_type vVar3;
  AssertionResult gtest_ar_1;
  int i;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  size_type last_bucket_count;
  int last_element;
  size_type empty_bucket_count;
  bool *in_stack_fffffffffffffe88;
  AssertionResult *in_stack_fffffffffffffe90;
  unsigned_long *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffeb0;
  Type in_stack_fffffffffffffebc;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult local_138 [2];
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  pair<int,_int> this_02;
  undefined4 in_stack_ffffffffffffff08;
  int iVar4;
  undefined4 in_stack_ffffffffffffff0c;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff10;
  int local_e4;
  string local_e0 [55];
  undefined1 local_a9;
  AssertionResult local_a8 [3];
  size_type local_78;
  AssertionResult local_70;
  size_type local_60;
  value_type local_30;
  pair<int,_int> local_20;
  int local_18;
  int local_14;
  size_type local_10;
  
  bVar1 = google::
          HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_clear_no_resize
                    ((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    local_10 = google::
               BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xbb31ac);
    local_14 = 1;
    while (sVar2 = google::
                   BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ::bucket_count((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xbb31cd), sVar2 == local_10) {
      in_stack_fffffffffffffea0 = in_RDI + 0x10;
      local_30 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(in_stack_fffffffffffffeb0,(int)((ulong)in_RDI >> 0x20));
      local_20 = local_30.first;
      local_18 = local_30.second;
      google::
      BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffff10,
               (value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      local_14 = local_14 + 1;
    }
    local_60 = google::
               BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xbb325f);
    google::
    HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::clear_no_resize((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)0xbb3275);
    local_78 = google::
               BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xbb3283);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_RDI,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (unsigned_long *)in_stack_fffffffffffffe90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffe98 =
           (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0xbb32ea);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                 (char *)in_stack_fffffffffffffeb0,(int)((ulong)in_RDI >> 0x20),
                 in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff10,
                 (Message *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      testing::Message::~Message((Message *)0xbb3347);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbb33b5);
    local_a9 = google::
               BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::empty((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0xbb33c3);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(type *)0xbb33e5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffec0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                 (char *)in_stack_fffffffffffffeb0,(int)((ulong)in_RDI >> 0x20),
                 in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff10,
                 (Message *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      std::__cxx11::string::~string(local_e0);
      testing::Message::~Message((Message *)0xbb34b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbb354f);
    for (local_e4 = 1; local_e4 < local_14; local_e4 = local_e4 + 1) {
      this_00 = (AssertHelper *)(in_RDI + 0x10);
      vVar3 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffeb0,(int)((ulong)in_RDI >> 0x20));
      this_02 = vVar3.first;
      iVar4 = vVar3.second;
      google::
      BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffff0c,iVar4));
      this_01 = (AssertHelper *)
                google::
                BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xbb35e0);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (in_RDI,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(unsigned_long *)this_00
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
      if (!bVar1) {
        testing::Message::Message((Message *)this_01);
        testing::AssertionResult::failure_message((AssertionResult *)0xbb3647);
        testing::internal::AssertHelper::AssertHelper
                  (this_01,in_stack_fffffffffffffebc,(char *)in_stack_fffffffffffffeb0,
                   (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffea0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_02,(Message *)CONCAT44(in_stack_ffffffffffffff0c,iVar4));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xbb3693);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xbb36f5);
    }
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ClearNoResize) {
  if (!this->ht_.supports_clear_no_resize()) return;
  typename TypeParam::size_type empty_bucket_count = this->ht_.bucket_count();
  int last_element = 1;
  while (this->ht_.bucket_count() == empty_bucket_count) {
    this->ht_.insert(this->UniqueObject(last_element));
    ++last_element;
  }
  typename TypeParam::size_type last_bucket_count = this->ht_.bucket_count();
  this->ht_.clear_no_resize();
  EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  EXPECT_TRUE(this->ht_.empty());

  // When inserting the same number of elements again, no resize
  // should be necessary.
  for (int i = 1; i < last_element; ++i) {
    this->ht_.insert(this->UniqueObject(last_element + i));
    EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  }
}